

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O0

void __thiscall Acceptor::do_accept(Acceptor *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  log_level lVar4;
  int *piVar5;
  uint *puVar6;
  char *pcVar7;
  Logger *pLVar8;
  element_type *peVar9;
  lock_guard<std::mutex> local_58;
  lock_guard<std::mutex> lck;
  undefined1 local_40 [8];
  TcpConnSP conn;
  EventLoop *sub_loop;
  socklen_t conn_addrlen;
  sockaddr_in conn_addr;
  int connfd;
  Acceptor *this_local;
  
  sub_loop._0_4_ = 0x10;
  unique0x100004c3 = this;
  while( true ) {
    while( true ) {
      while( true ) {
        while (conn_addr.sin_zero._0_4_ =
                    accept(this->ac_listen_fd,(sockaddr *)((long)&sub_loop + 4),
                           (socklen_t *)&sub_loop), conn_addr.sin_zero._0_4_ != -1) {
          pLVar8 = Logger::get_instance();
          bVar2 = Logger::is_inited(pLVar8);
          if ((!bVar2) && (-1 < pr_level)) {
            printf("[%-5s][%s:%d] logger must be inited before user!\n","error","do_accept",0x5c);
          }
          lVar4 = Logger::get_log_level();
          if (1 < (int)lVar4) {
            pLVar8 = Logger::get_instance();
            Logger::write_log(pLVar8,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/acceptor.cpp"
                              ,"do_accept",0x5c,LOG_LEVEL_INFO,
                              "accepted one connection, sock fd is %d\n",conn_addr.sin_zero._0_4_);
            pLVar8 = Logger::get_instance();
            Logger::flush(pLVar8);
          }
          conn.super___shared_ptr<TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               TcpServer::get_next_loop(this->ac_server);
          std::make_shared<TcpConnection,TcpServer*&,EventLoop*&,int&,sockaddr_in&,unsigned_int&>
                    ((TcpServer **)local_40,(EventLoop **)this,
                     (int *)&conn.super___shared_ptr<TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,(sockaddr_in *)conn_addr.sin_zero,
                     (uint *)((long)&sub_loop + 4));
          peVar9 = std::__shared_ptr_access<TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_40);
          TcpConnection::set_connected_cb(peVar9,&this->ac_server->ts_connected_cb);
          peVar9 = std::__shared_ptr_access<TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_40);
          TcpConnection::set_message_cb(peVar9,&this->ac_server->ts_message_cb);
          peVar9 = std::__shared_ptr_access<TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_40);
          TcpConnection::set_close_cb(peVar9,&this->ac_server->ts_close_cb);
          peVar9 = std::__shared_ptr_access<TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_40);
          TcpConnection::add_task(peVar9);
          std::lock_guard<std::mutex>::lock_guard(&local_58,&this->ac_server->ts_mutex);
          TcpServer::add_new_tcp_conn(this->ac_server,(TcpConnSP *)local_40);
          std::lock_guard<std::mutex>::~lock_guard(&local_58);
          std::shared_ptr<TcpConnection>::~shared_ptr((shared_ptr<TcpConnection> *)local_40);
        }
        piVar5 = __errno_location();
        if (*piVar5 != 4) break;
        if (-1 < pr_level) {
          printf("[%-5s][%s:%d] accept fail, errno=EINTR, continue\n","error","do_accept",0x48);
        }
      }
      piVar5 = __errno_location();
      if (*piVar5 != 0x18) break;
      if (0 < pr_level) {
        printf("[%-5s][%s:%d] accept fail, errno=EMFILE, use idle fd\n","warn","do_accept",0x4c);
      }
      close(this->ac_idle_fd);
      iVar3 = accept(this->ac_listen_fd,(sockaddr *)0x0,(socklen_t *)0x0);
      this->ac_idle_fd = iVar3;
      close(this->ac_idle_fd);
      iVar3 = open("/dev/null",0x80000);
      this->ac_idle_fd = iVar3;
    }
    piVar5 = __errno_location();
    if (*piVar5 == 0xb) break;
    if (-1 < pr_level) {
      puVar6 = (uint *)__errno_location();
      uVar1 = *puVar6;
      piVar5 = __errno_location();
      pcVar7 = strerror(*piVar5);
      printf("[%-5s][%s:%d] accept fail, error no:%d, error str:%s\n","error","do_accept",0x57,
             (ulong)uVar1,pcVar7);
    }
  }
  if (-1 < pr_level) {
    printf("[%-5s][%s:%d] accept fail, errno=EAGAIN, break\n","error","do_accept",0x53);
  }
  return;
}

Assistant:

void Acceptor::do_accept()
{
    int connfd;
    struct sockaddr_in conn_addr;
    socklen_t conn_addrlen = sizeof conn_addr;
     while(true) {
        if (connfd = accept(ac_listen_fd, (struct sockaddr*)&conn_addr, &conn_addrlen); connfd == -1) {
            if (errno == EINTR) {
                PR_ERROR("accept fail, errno=EINTR, continue\n");
                continue;
            }
            else if (errno == EMFILE) {
                PR_WARN("accept fail, errno=EMFILE, use idle fd\n");
                close(ac_idle_fd);
                ac_idle_fd = accept(ac_listen_fd, NULL, NULL);
                close(ac_idle_fd);
                ac_idle_fd = open("/dev/null", O_RDONLY | O_CLOEXEC);
            }
            else if (errno == EAGAIN) {
                PR_ERROR("accept fail, errno=EAGAIN, break\n");
                break;
            }
            else {
                PR_ERROR("accept fail, error no:%d, error str:%s\n", errno,strerror(errno));
                continue;
            }
        }
        else {
LOG_INFO("accepted one connection, sock fd is %d\n", connfd);
            EventLoop* sub_loop = ac_server->get_next_loop();
            
            TcpConnSP conn = make_shared<TcpConnection>(ac_server, sub_loop, connfd, conn_addr, conn_addrlen);
            conn->set_connected_cb(ac_server->ts_connected_cb);
            conn->set_message_cb(ac_server->ts_message_cb);
            conn->set_close_cb(ac_server->ts_close_cb);
            conn->add_task();

            lock_guard<mutex> lck(ac_server->ts_mutex);
            ac_server->add_new_tcp_conn(conn);     
        }
    }
}